

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  
  if ((str != (char *)0x0) &&
     ((sVar2 = (size_t)(uint)len, 0 < len || (sVar2 = strlen(str), -1 < (int)sVar2)))) {
    uVar7 = (uint)sVar2;
    pbVar6 = (byte *)target;
    if ((target != (char *)0x0) ||
       (target = (char *)(*xmlMallocAtomic)((size_t)sVar2 + 1), pbVar6 = (byte *)target,
       (byte *)target != (byte *)0x0)) {
      do {
        if (uVar7 == 0) {
          *target = 0;
          return (char *)pbVar6;
        }
        bVar4 = *str;
        if (bVar4 == 0x25 && 2 < (uint)sVar2) {
          bVar1 = ((byte *)str)[1];
          bVar3 = bVar1 - 0x30;
          if (((9 < bVar3) && ((byte)((bVar1 & 0xdf) + 0xb9) < 0xfa)) ||
             (((byte)(((byte *)str)[2] - 0x3a) < 0xf6 &&
              ((byte)((((byte *)str)[2] & 0xdf) + 0xb9) < 0xfa)))) goto LAB_00190358;
          if (bVar3 < 10) {
LAB_0019038c:
            *target = bVar3;
          }
          else {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar3 = bVar1 + 0xa9;
              goto LAB_0019038c;
            }
            if ((byte)(bVar1 + 0xbf) < 6) {
              bVar3 = bVar1 - 0x37;
              goto LAB_0019038c;
            }
          }
          bVar4 = ((byte *)str)[2];
          if ((byte)(bVar4 - 0x30) < 10) {
            bVar4 = *target << 4 | bVar4 - 0x30;
LAB_001903ca:
            *target = bVar4;
          }
          else {
            if ((byte)(bVar4 + 0x9f) < 6) {
              bVar4 = bVar4 + *target * '\x10' + 0xa9;
              goto LAB_001903ca;
            }
            if ((byte)(bVar4 + 0xbf) < 6) {
              bVar4 = (bVar4 + *target * '\x10') - 0x37;
              goto LAB_001903ca;
            }
          }
          str = (char *)((byte *)str + 3);
          iVar5 = -3;
        }
        else {
LAB_00190358:
          str = (char *)((byte *)str + 1);
          *target = bVar4;
          iVar5 = -1;
        }
        target = (char *)((byte *)target + 1);
        uVar7 = (uint)sVar2 + iVar5;
        sVar2 = (size_t)uVar7;
      } while( true );
    }
    xmlURIErrMemory("unescaping URI value\n");
  }
  return (char *)0x0;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = (char *) xmlMallocAtomic(len + 1);
	if (ret == NULL) {
            xmlURIErrMemory("unescaping URI value\n");
	    return(NULL);
	}
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = *out * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = *out * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = *out * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
	    out++;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}